

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O3

_Bool csp_if_eth_unpack_header
                (csp_eth_header_t *buf,uint32_t *packet_id,uint16_t *seg_size,
                uint16_t *packet_length)

{
  if (packet_length != (uint16_t *)0x0 &&
      (seg_size != (uint16_t *)0x0 && packet_id != (uint32_t *)0x0)) {
    *packet_id = CONCAT22(buf->packet_id,buf->src_addr);
    *seg_size = buf->seg_size << 8 | buf->seg_size >> 8;
    *packet_length = buf->packet_length << 8 | buf->packet_length >> 8;
  }
  return packet_length != (uint16_t *)0x0 &&
         (seg_size != (uint16_t *)0x0 && packet_id != (uint32_t *)0x0);
}

Assistant:

bool csp_if_eth_unpack_header(csp_eth_header_t * buf, 
                              uint32_t * packet_id,
                              uint16_t * seg_size, uint16_t * packet_length) {

    if (packet_id == NULL) return false;
    if (seg_size == NULL) return false;
    if (packet_length == NULL) return false;

    *packet_id = buf->packet_id << 16 | buf->src_addr;
    *seg_size = be16toh(buf->seg_size);
    *packet_length = be16toh(buf->packet_length);

    return true;
}